

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

bool __thiscall r_exec::Group::load(Group *this,View *view,Code *object)

{
  ulong uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  Controller *c_00;
  InputLessPGMController *this_00;
  AntiPGMController *this_01;
  Code *pCVar6;
  CSTController *pCVar7;
  mapped_type *pmVar8;
  Group *pGVar9;
  undefined4 extraout_var;
  float fVar10;
  float fVar11;
  uint64_t local_f8;
  uint64_t local_f0;
  ulong local_e8;
  uint64_t i;
  MDLController *c_5;
  uint64_t uStack_d0;
  bool inject_in_secondary_group;
  CSTController *local_c8;
  CSTController *c_4;
  int local_b4;
  Controller *local_b0;
  Controller *c_3;
  string str;
  uint64_t local_88;
  AntiPGMController *local_80;
  AntiPGMController *c_2;
  InputLessPGMController *local_70;
  InputLessPGMController *c_1;
  Controller *local_50;
  PGMController *c;
  Group *local_40;
  undefined1 local_33;
  byte local_32;
  byte local_31;
  bool viewed_visible;
  bool viewing_c_salient;
  uint64_t uStack_30;
  bool viewing_c_active;
  Code *local_28;
  Code *object_local;
  View *view_local;
  Group *this_local;
  
  local_28 = object;
  object_local = (Code *)view;
  view_local = (View *)this;
  (*(object->super__Object)._vptr__Object[4])(object,0);
  uVar2 = r_code::Atom::getDescriptor();
  pCVar6 = object_local;
  switch(uVar2) {
  case 0xc3:
    local_f8 = View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->other_views,&local_f8);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    break;
  case 0xc4:
    for (local_e8 = 0; uVar1 = local_e8, iVar4 = (*(local_28->super__Object)._vptr__Object[10])(),
        pCVar6 = object_local, uVar1 < (ushort)iVar4; local_e8 = local_e8 + 1) {
      iVar4 = (*(local_28->super__Object)._vptr__Object[9])(local_28,local_e8 & 0xffff);
      r_code::list<r_code::Code_*>::push_back
                ((list<r_code::Code_*> *)(CONCAT44(extraout_var,iVar4) + 0x18),&local_28);
    }
    local_f0 = View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->other_views,&local_f0);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    break;
  case 200:
    uStack_30 = View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->group_views,&stack0xffffffffffffffd0);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    fVar10 = get_c_act(this);
    fVar11 = get_c_act_thr(this);
    local_31 = fVar11 < fVar10;
    fVar10 = get_c_sln(this);
    fVar11 = get_c_sln_thr(this);
    local_32 = fVar11 < fVar10;
    fVar10 = View::get_vis((View *)object_local);
    fVar11 = get_vis_thr(this);
    local_33 = fVar11 < fVar10;
    if ((((local_31 & 1) != 0) && ((local_32 & 1) != 0)) && ((bool)local_33)) {
      bVar3 = View::get_cov((View *)object_local);
      local_40 = this;
      pmVar5 = std::
               unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
               ::operator[]((unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
                             *)&local_28[6].markers.free_cell_count,&local_40);
      *pmVar5 = bVar3;
    }
    break;
  case 0xc9:
    c = (PGMController *)View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,(key_type *)&c);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    c_00 = (Controller *)operator_new(0xa0);
    PGMController::PGMController((PGMController *)c_00,(View *)object_local);
    local_50 = c_00;
    core::P<r_exec::Controller>::operator=
              ((P<r_exec::Controller> *)
               &object_local[1].markers.cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish,c_00);
    bVar3 = is_active_pgm(this,(View *)object_local);
    if (bVar3) {
      (*(local_50->super__Object)._vptr__Object[5])();
    }
    break;
  case 0xca:
    local_88 = View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,&local_88);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    pCVar6 = core::P::operator_cast_to_Code_
                       ((P *)&(object_local->markers).cells.
                              super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
    r_code::Utils::GetString<r_code::Code>((Utils *)&c_3,pCVar6,1);
    local_b0 = CPPPrograms::New((string *)&c_3,(View *)object_local);
    if (local_b0 == (Controller *)0x0) {
      this_local._7_1_ = 0;
      local_b4 = 1;
    }
    else {
      core::P<r_exec::Controller>::operator=
                ((P<r_exec::Controller> *)
                 &object_local[1].markers.cells.
                  super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                  ._M_impl.super__Vector_impl_data._M_finish,local_b0);
      bVar3 = is_active_pgm(this,(View *)object_local);
      if (bVar3) {
        (*(local_b0->super__Object)._vptr__Object[5])();
      }
      local_b4 = 2;
    }
    std::__cxx11::string::~string((string *)&c_3);
    if (local_b4 == 1) goto LAB_002389c8;
    break;
  case 0xcb:
    c_1 = (InputLessPGMController *)View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->input_less_ipgm_views,(key_type *)&c_1);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    this_00 = (InputLessPGMController *)operator_new(200);
    InputLessPGMController::InputLessPGMController(this_00,(View *)object_local);
    local_70 = this_00;
    core::P<r_exec::Controller>::operator=
              ((P<r_exec::Controller> *)
               &object_local[1].markers.cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish,(Controller *)this_00);
    bVar3 = is_active_pgm(this,(View *)object_local);
    if (bVar3) {
      (*(local_70->super__PGMController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])();
    }
    break;
  case 0xcc:
    c_2 = (AntiPGMController *)View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->anti_ipgm_views,(key_type *)&c_2);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    this_01 = (AntiPGMController *)operator_new(200);
    AntiPGMController::AntiPGMController(this_01,(View *)object_local);
    local_80 = this_01;
    core::P<r_exec::Controller>::operator=
              ((P<r_exec::Controller> *)
               &object_local[1].markers.cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish,(Controller *)this_01);
    bVar3 = is_active_pgm(this,(View *)object_local);
    if (bVar3) {
      (*(local_80->super__PGMController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])();
    }
    break;
  case 0xcd:
    c_4 = (CSTController *)View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,(key_type *)&c_4);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    pCVar7 = (CSTController *)operator_new(0x1e8);
    CSTController::CSTController(pCVar7,(View *)object_local);
    local_c8 = pCVar7;
    core::P<r_exec::Controller>::operator=
              ((P<r_exec::Controller> *)
               &object_local[1].markers.cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish,(Controller *)pCVar7);
    pCVar7 = local_c8;
    pGVar9 = get_secondary_group(this);
    CSTController::set_secondary_host(pCVar7,pGVar9);
    bVar3 = is_active_pgm(this,(View *)object_local);
    if (bVar3) {
      (*(local_c8->super_HLPController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])();
    }
    break;
  case 0xce:
    uStack_d0 = View::get_oid((View *)object_local);
    pmVar8 = std::
             unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
             ::operator[](&this->ipgm_views,&stack0xffffffffffffff30);
    core::P<r_exec::View>::operator=(pmVar8,(View *)pCVar6);
    i = (uint64_t)MDLController::New((View *)object_local,(bool *)((long)&c_5 + 7));
    core::P<r_exec::Controller>::operator=
              ((P<r_exec::Controller> *)
               &object_local[1].markers.cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish,(Controller *)i);
    if ((c_5._7_1_ & 1) != 0) {
      pGVar9 = get_secondary_group(this);
      load_secondary_mdl_controller(pGVar9,(View *)object_local);
    }
    bVar3 = is_active_pgm(this,(View *)object_local);
    if (bVar3) {
      (**(code **)(*(long *)i + 0x28))();
    }
  }
  this_local._7_1_ = 1;
LAB_002389c8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Group::load(View *view, Code *object)
{
    switch (object->code(0).getDescriptor()) {
    case Atom::GROUP: {
        group_views[view->get_oid()] = view;
        // init viewing_group.
        bool viewing_c_active = get_c_act() > get_c_act_thr();
        bool viewing_c_salient = get_c_sln() > get_c_sln_thr();
        bool viewed_visible = view->get_vis() > get_vis_thr();

        if (viewing_c_active && viewing_c_salient && viewed_visible) { // visible group in a c-salient, c-active group.
            ((Group *)object)->viewing_groups[this] = view->get_cov();    // init the group's viewing groups.
        }

        break;
    }

    case Atom::INSTANTIATED_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        PGMController *c = new PGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: {
        input_less_ipgm_views[view->get_oid()] = view;
        InputLessPGMController *c = new InputLessPGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_ANTI_PROGRAM: {
        anti_ipgm_views[view->get_oid()] = view;
        AntiPGMController *c = new AntiPGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_CPP_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        std::string str = Utils::GetString<Code>(view->object, ICPP_PGM_NAME);
        Controller *c = CPPPrograms::New(str, view); // now will be added to the deadline at start time.

        if (!c) {
            return false;
        }

        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::COMPOSITE_STATE: {
        ipgm_views[view->get_oid()] = view;
        CSTController *c = new CSTController(view);
        view->controller = c;
        c->set_secondary_host(get_secondary_group());

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::MODEL: {
        ipgm_views[view->get_oid()] = view;
        bool inject_in_secondary_group;
        MDLController *c = MDLController::New(view, inject_in_secondary_group);
        view->controller = c;

        if (inject_in_secondary_group) {
            get_secondary_group()->load_secondary_mdl_controller(view);
        }

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::MARKER: // populate the marker set of the referenced objects.
        for (uint64_t i = 0; i < object->references_size(); ++i) {
            object->get_reference(i)->markers.push_back(object);
        }

        other_views[view->get_oid()] = view;
        break;

    case Atom::OBJECT:
        other_views[view->get_oid()] = view;
        break;
    }

    return true;
}